

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O0

void __thiscall
icu_63::FractionalPartSubstitution::doSubstitution
          (FractionalPartSubstitution *this,double number,UnicodeString *toInsertInto,int32_t _pos,
          int32_t recursionCount,UErrorCode *status)

{
  bool bVar1;
  int8_t iVar2;
  int32_t iVar3;
  NFRuleSet *pNVar4;
  int64_t digit;
  int32_t didx;
  UBool pad;
  undefined1 local_80 [8];
  DecimalQuantity dl;
  UErrorCode *status_local;
  int32_t recursionCount_local;
  int32_t _pos_local;
  UnicodeString *toInsertInto_local;
  double number_local;
  FractionalPartSubstitution *this_local;
  
  dl._72_8_ = status;
  if (this->byDigits == '\0') {
    NFSubstitution::doSubstitution
              (&this->super_NFSubstitution,number,toInsertInto,_pos,recursionCount,status);
  }
  else {
    icu_63::number::impl::DecimalQuantity::DecimalQuantity((DecimalQuantity *)local_80);
    icu_63::number::impl::DecimalQuantity::setToDouble((DecimalQuantity *)local_80,number);
    icu_63::number::impl::DecimalQuantity::roundToMagnitude
              ((DecimalQuantity *)local_80,-0x14,UNUM_FOUND_HALFEVEN,(UErrorCode *)dl._72_8_);
    bVar1 = false;
    for (digit._4_4_ = icu_63::number::impl::DecimalQuantity::getLowerDisplayMagnitude
                                 ((DecimalQuantity *)local_80); digit._4_4_ < 0;
        digit._4_4_ = digit._4_4_ + 1) {
      if ((bVar1) && (this->useSpaces != '\0')) {
        iVar3 = NFSubstitution::getPos(&this->super_NFSubstitution);
        UnicodeString::insert(toInsertInto,_pos + iVar3,L' ');
      }
      else {
        bVar1 = true;
      }
      iVar2 = icu_63::number::impl::DecimalQuantity::getDigit
                        ((DecimalQuantity *)local_80,digit._4_4_);
      pNVar4 = NFSubstitution::getRuleSet(&this->super_NFSubstitution);
      iVar3 = NFSubstitution::getPos(&this->super_NFSubstitution);
      NFRuleSet::format(pNVar4,(long)iVar2,toInsertInto,_pos + iVar3,recursionCount,
                        (UErrorCode *)dl._72_8_);
    }
    if (!bVar1) {
      pNVar4 = NFSubstitution::getRuleSet(&this->super_NFSubstitution);
      iVar3 = NFSubstitution::getPos(&this->super_NFSubstitution);
      NFRuleSet::format(pNVar4,0,toInsertInto,_pos + iVar3,recursionCount,(UErrorCode *)dl._72_8_);
    }
    icu_63::number::impl::DecimalQuantity::~DecimalQuantity((DecimalQuantity *)local_80);
  }
  return;
}

Assistant:

void
FractionalPartSubstitution::doSubstitution(double number, UnicodeString& toInsertInto,
                                           int32_t _pos, int32_t recursionCount, UErrorCode& status) const
{
  // if we're not in "byDigits" mode, just use the inherited
  // doSubstitution() routine
  if (!byDigits) {
    NFSubstitution::doSubstitution(number, toInsertInto, _pos, recursionCount, status);

    // if we're in "byDigits" mode, transform the value into an integer
    // by moving the decimal point eight places to the right and
    // pulling digits off the right one at a time, formatting each digit
    // as an integer using this substitution's owning rule set
    // (this is slower, but more accurate, than doing it from the
    // other end)
  } else {
    //          int32_t numberToFormat = (int32_t)uprv_round(transformNumber(number) * uprv_pow(10, kMaxDecimalDigits));
    //          // this flag keeps us from formatting trailing zeros.  It starts
    //          // out false because we're pulling from the right, and switches
    //          // to true the first time we encounter a non-zero digit
    //          UBool doZeros = FALSE;
    //          for (int32_t i = 0; i < kMaxDecimalDigits; i++) {
    //              int64_t digit = numberToFormat % 10;
    //              if (digit != 0 || doZeros) {
    //                  if (doZeros && useSpaces) {
    //                      toInsertInto.insert(_pos + getPos(), gSpace);
    //                  }
    //                  doZeros = TRUE;
    //                  getRuleSet()->format(digit, toInsertInto, _pos + getPos());
    //              }
    //              numberToFormat /= 10;
    //          }

    DecimalQuantity dl;
    dl.setToDouble(number);
    dl.roundToMagnitude(-20, UNUM_ROUND_HALFEVEN, status);     // round to 20 fraction digits.
    
    UBool pad = FALSE;
    for (int32_t didx = dl.getLowerDisplayMagnitude(); didx<0; didx++) {
      // Loop iterates over fraction digits, starting with the LSD.
      //   include both real digits from the number, and zeros
      //   to the left of the MSD but to the right of the decimal point.
      if (pad && useSpaces) {
        toInsertInto.insert(_pos + getPos(), gSpace);
      } else {
        pad = TRUE;
      }
      int64_t digit = dl.getDigit(didx);
      getRuleSet()->format(digit, toInsertInto, _pos + getPos(), recursionCount, status);
    }

    if (!pad) {
      // hack around lack of precision in digitlist. if we would end up with
      // "foo point" make sure we add a " zero" to the end.
      getRuleSet()->format((int64_t)0, toInsertInto, _pos + getPos(), recursionCount, status);
    }
  }
}